

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void pcache1RemoveFromHash(PgHdr1 *pPage)

{
  PCache1 *pPVar1;
  PgHdr1 *pPVar2;
  PgHdr1 **ppPVar3;
  PgHdr1 **ppPVar4;
  
  pPVar1 = pPage->pCache;
  ppPVar3 = pPVar1->apHash + (ulong)pPage->iKey % (ulong)pPVar1->nHash;
  do {
    ppPVar4 = ppPVar3;
    pPVar2 = *ppPVar4;
    ppPVar3 = &pPVar2->pNext;
  } while (pPVar2 != pPage);
  *ppPVar4 = *ppPVar3;
  pPVar1->nPage = pPVar1->nPage - 1;
  return;
}

Assistant:

static void pcache1RemoveFromHash(PgHdr1 *pPage){
  unsigned int h;
  PCache1 *pCache = pPage->pCache;
  PgHdr1 **pp;

  assert( sqlite3_mutex_held(pCache->pGroup->mutex) );
  h = pPage->iKey % pCache->nHash;
  for(pp=&pCache->apHash[h]; (*pp)!=pPage; pp=&(*pp)->pNext);
  *pp = (*pp)->pNext;

  pCache->nPage--;
}